

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

char mctools_drive_letter(mcu8str *rawpath)

{
  char cVar1;
  byte bVar2;
  mcu8str path;
  mcu8str local_20;
  
  mctools_impl_view_no_winnamespace(&local_20,rawpath);
  if ((local_20.size < 2) || (local_20.c_str[1] != ':')) {
    cVar1 = '\0';
  }
  else {
    cVar1 = *local_20.c_str;
    if ((0x19 < (byte)(cVar1 + 0xbfU)) &&
       (bVar2 = cVar1 + 0x9f, cVar1 = cVar1 + -0x20, 0x19 < bVar2)) {
      cVar1 = '\0';
    }
  }
  return cVar1;
}

Assistant:

char mctools_drive_letter( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(rawpath);
    if ( path.size < 2 )
      return 0;
    if ( path.c_str[1] != ':' )
      return 0;
    if ( path.c_str[0] >= 'A' && path.c_str[0] <= 'Z' )
      return path.c_str[0];
    if ( path.c_str[0] >= 'a' && path.c_str[0] <= 'z' )
      return (char)(path.c_str[0] - 32);//uppercase
    return 0;
  }